

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  int sizes [17];
  int next_code [16];
  int aiStack_38 [2];
  
  sizes[0xc] = 0;
  sizes[0xd] = 0;
  sizes[0xe] = 0;
  sizes[0xf] = 0;
  sizes[8] = 0;
  sizes[9] = 0;
  sizes[10] = 0;
  sizes[0xb] = 0;
  sizes[4] = 0;
  sizes[5] = 0;
  sizes[6] = 0;
  sizes[7] = 0;
  sizes[0] = 0;
  sizes[1] = 0;
  sizes[2] = 0;
  sizes[3] = 0;
  sizes[0x10] = 0;
  uVar10 = 0;
  memset(z,0,0x400);
  uVar4 = (ulong)(uint)num;
  if (num < 1) {
    uVar4 = uVar10;
  }
  for (; uVar4 != uVar10; uVar10 = uVar10 + 1) {
    sizes[sizelist[uVar10]] = sizes[sizelist[uVar10]] + 1;
  }
  lVar6 = 1;
  while (lVar6 != 0x10) {
    bVar3 = (byte)lVar6;
    piVar1 = sizes + lVar6;
    lVar6 = lVar6 + 1;
    if (1 << (bVar3 & 0x1f) < *piVar1) goto LAB_00143b11;
  }
  iVar5 = 0;
  bVar3 = 0xf;
  lVar6 = -0xf;
  iVar7 = 0;
  while( true ) {
    if (lVar6 == 0) {
      z->maxcode[0x10] = 0x10000;
      for (uVar10 = 0; uVar10 != uVar4; uVar10 = uVar10 + 1) {
        bVar3 = sizelist[uVar10];
        if (bVar3 != 0) {
          iVar5 = next_code[bVar3];
          lVar6 = (long)(int)(iVar5 - (uint)z->firstcode[bVar3]) + (ulong)z->firstsymbol[bVar3];
          z->size[lVar6] = bVar3;
          z->value[lVar6] = (ushort)uVar10;
          if (bVar3 < 10) {
            uVar8 = (ushort)iVar5 << 8 | (ushort)iVar5 >> 8;
            uVar9 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
            uVar9 = (uVar9 >> 2 & 0x3333) + (uVar9 & 0x3333) * 4;
            for (uVar11 = (ulong)((uVar9 >> 1 & 0x5555) + (uVar9 & 0x5555) * 2 >>
                                 (0x10 - bVar3 & 0x1f)); uVar11 < 0x200;
                uVar11 = uVar11 + (1L << (bVar3 & 0x3f))) {
              z->fast[uVar11] = (ushort)uVar10 | (ushort)bVar3 << 9;
            }
          }
          next_code[bVar3] = iVar5 + 1;
        }
      }
      return 1;
    }
    aiStack_38[lVar6] = iVar5;
    *(short *)((long)z->maxcode + lVar6 * 2) = (short)iVar5;
    *(short *)(z->size + lVar6 * 2) = (short)iVar7;
    iVar2 = sizes[lVar6 + 0x10];
    iVar5 = iVar5 + iVar2;
    if ((iVar2 != 0) && (1 << ((char)lVar6 + 0x10U & 0x1f) < iVar5)) break;
    z->maxcode[lVar6 + 0x10] = iVar5 << (bVar3 & 0x1f);
    iVar5 = iVar5 * 2;
    iVar7 = iVar7 + iVar2;
    bVar3 = bVar3 - 1;
    lVar6 = lVar6 + 1;
  }
LAB_00143b11:
  *(char **)(in_FS_OFFSET + -0x10) = "Corrupt PNG";
  return 0;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 0, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      if (sizes[i] > (1 << i))
         return stbi__err("bad sizes", "Corrupt PNG");
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (stbi__uint16) code;
      z->firstsymbol[i] = (stbi__uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return stbi__err("bad codelengths","Corrupt PNG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
         z->size [c] = (stbi_uc     ) s;
         z->value[c] = (stbi__uint16) i;
         if (s <= STBI__ZFAST_BITS) {
            int j = stbi__bit_reverse(next_code[s],s);
            while (j < (1 << STBI__ZFAST_BITS)) {
               z->fast[j] = fastv;
               j += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}